

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mesh * rf_gen_mesh_sphere(rf_mesh *__return_storage_ptr__,float radius,int rings,int slices,
                            rf_allocator allocator,rf_allocator temp_allocator)

{
  long lVar1;
  uint *puVar2;
  par_shapes_mesh *m;
  float *pfVar3;
  long *in_FS_OFFSET;
  rf_mesh *mesh;
  long local_f8;
  rf_int k;
  par_shapes_mesh *sphere;
  int slices_local;
  int rings_local;
  float radius_local;
  rf_allocator allocator_local;
  
  allocator_local.user_data = allocator.allocator_proc;
  _rings_local = allocator.user_data;
  memset(__return_storage_ptr__,0,0x70);
  puVar2 = (uint *)(*(code *)allocator_local.user_data)(&rings_local);
  __return_storage_ptr__->vbo_id = puVar2;
  memset(__return_storage_ptr__->vbo_id,0,0x1c);
  lVar1 = *in_FS_OFFSET;
  *(void **)(lVar1 + -0x440) = temp_allocator.user_data;
  *(rf_allocator_proc **)(lVar1 + -0x438) = temp_allocator.allocator_proc;
  m = par_shapes_create_parametric_sphere(slices,rings);
  par_shapes_scale(m,radius,radius,radius);
  pfVar3 = (float *)(*(code *)allocator_local.user_data)(&rings_local,1);
  __return_storage_ptr__->vertices = pfVar3;
  pfVar3 = (float *)(*(code *)allocator_local.user_data)(&rings_local,1);
  __return_storage_ptr__->texcoords = pfVar3;
  pfVar3 = (float *)(*(code *)allocator_local.user_data)(&rings_local);
  __return_storage_ptr__->normals = pfVar3;
  __return_storage_ptr__->vertex_count = m->ntriangles * 3;
  __return_storage_ptr__->triangle_count = m->ntriangles;
  for (local_f8 = 0; local_f8 < __return_storage_ptr__->vertex_count; local_f8 = local_f8 + 1) {
    __return_storage_ptr__->vertices[local_f8 * 3] =
         m->points[(int)((uint)m->triangles[local_f8] * 3)];
    __return_storage_ptr__->vertices[local_f8 * 3 + 1] =
         m->points[(int)((uint)m->triangles[local_f8] * 3 + 1)];
    __return_storage_ptr__->vertices[local_f8 * 3 + 2] =
         m->points[(int)((uint)m->triangles[local_f8] * 3 + 2)];
    __return_storage_ptr__->normals[local_f8 * 3] =
         m->normals[(int)((uint)m->triangles[local_f8] * 3)];
    __return_storage_ptr__->normals[local_f8 * 3 + 1] =
         m->normals[(int)((uint)m->triangles[local_f8] * 3 + 1)];
    __return_storage_ptr__->normals[local_f8 * 3 + 2] =
         m->normals[(int)((uint)m->triangles[local_f8] * 3 + 2)];
    __return_storage_ptr__->texcoords[local_f8 * 2] =
         m->tcoords[(int)((uint)m->triangles[local_f8] << 1)];
    __return_storage_ptr__->texcoords[local_f8 * 2 + 1] =
         m->tcoords[(int)((uint)m->triangles[local_f8] * 2 + 1)];
  }
  par_shapes_free_mesh(m);
  lVar1 = *in_FS_OFFSET;
  *(undefined8 *)(lVar1 + -0x440) = 0;
  *(undefined8 *)(lVar1 + -0x438) = 0;
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_sphere(float radius, int rings, int slices, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
    {
        par_shapes_mesh* sphere = par_shapes_create_parametric_sphere(slices, rings);
        par_shapes_scale(sphere, radius, radius, radius);
        // NOTE: Soft normals are computed internally

        mesh.vertices  = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 3 * sizeof(float));
        mesh.texcoords = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 2 * sizeof(float));
        mesh.normals   = (float*) RF_ALLOC(allocator, sphere->ntriangles * 3 * 3 * sizeof(float));

        mesh.vertex_count = sphere->ntriangles * 3;
        mesh.triangle_count = sphere->ntriangles;

        for (rf_int k = 0; k < mesh.vertex_count; k++)
        {
            mesh.vertices[k * 3    ] = sphere->points[sphere->triangles[k] * 3];
            mesh.vertices[k * 3 + 1] = sphere->points[sphere->triangles[k] * 3 + 1];
            mesh.vertices[k * 3 + 2] = sphere->points[sphere->triangles[k] * 3 + 2];

            mesh.normals[k * 3    ] = sphere->normals[sphere->triangles[k] * 3];
            mesh.normals[k * 3 + 1] = sphere->normals[sphere->triangles[k] * 3 + 1];
            mesh.normals[k * 3 + 2] = sphere->normals[sphere->triangles[k] * 3 + 2];

            mesh.texcoords[k * 2    ] = sphere->tcoords[sphere->triangles[k] * 2];
            mesh.texcoords[k * 2 + 1] = sphere->tcoords[sphere->triangles[k] * 2 + 1];
        }

        par_shapes_free_mesh(sphere);
    }
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}